

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O0

UINT8 device_start_ay8910_mame(AY8910_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 sampleRate;
  UINT32 rate;
  DEV_DATA *devData;
  void *chip;
  DEV_INFO *retDevInf_local;
  AY8910_CFG *cfg_local;
  
  chip = retDevInf;
  retDevInf_local = (DEV_INFO *)cfg;
  sampleRate = ay8910_start(&devData,(cfg->_genCfg).clock,cfg->chipType,cfg->chipFlags);
  if (devData == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    devData->chipInf = devData;
    INIT_DEVINF((DEV_INFO *)chip,devData,sampleRate,&devDef_AY8910_MAME);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

UINT8 device_start_ay8910_mame(const AY8910_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = ay8910_start(&chip, cfg->_genCfg.clock, cfg->chipType, cfg->chipFlags);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_AY8910_MAME);
	return 0x00;
}